

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O1

int Hop_ManCleanup(Hop_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Hop_Obj_t *pHVar5;
  uint *__ptr;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  if (p->fRefCount == 0) {
    __assert_fail("p->fRefCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopMan.c"
                  ,0x7d,"int Hop_ManCleanup(Hop_Man_t *)");
  }
  iVar1 = p->nObjs[4];
  iVar2 = p->nObjs[5];
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar6 = malloc(800);
  *(void **)(__ptr + 2) = pvVar6;
  if (0 < p->nTableSize) {
    lVar8 = 0;
    do {
      pHVar5 = p->pTable[lVar8];
      if ((pHVar5 != (Hop_Obj_t *)0x0) && (*(uint *)&pHVar5->field_0x20 < 0x40)) {
        uVar3 = __ptr[1];
        uVar4 = *__ptr;
        if (uVar3 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar7 = 0x10;
          }
          else {
            uVar7 = uVar4 * 2;
            if ((int)uVar7 <= (int)uVar4) goto LAB_007e3274;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar4 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar4 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = uVar7;
        }
LAB_007e3274:
        __ptr[1] = uVar3 + 1;
        *(Hop_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar3 * 8) = pHVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nTableSize);
  }
  uVar3 = __ptr[1];
  if (0 < (long)(int)uVar3) {
    lVar8 = *(long *)(__ptr + 2);
    lVar9 = 0;
    do {
      Hop_ObjDelete_rec(p,*(Hop_Obj_t **)(lVar8 + lVar9 * 8));
      lVar9 = lVar9 + 1;
    } while ((int)uVar3 != lVar9);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return (iVar2 + iVar1) - (p->nObjs[4] + p->nObjs[5]);
}

Assistant:

int Hop_ManCleanup( Hop_Man_t * p )
{
    Vec_Ptr_t * vObjs;
    Hop_Obj_t * pNode;
    int i, nNodesOld;
    assert( p->fRefCount );
    nNodesOld = Hop_ManNodeNum(p);
    // collect roots of dangling nodes
    vObjs = Vec_PtrAlloc( 100 );
    Hop_ManForEachNode( p, pNode, i )
        if ( Hop_ObjRefs(pNode) == 0 )
            Vec_PtrPush( vObjs, pNode );
    // recursively remove dangling nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, vObjs, pNode, i )
        Hop_ObjDelete_rec( p, pNode );
    Vec_PtrFree( vObjs );
    return nNodesOld - Hop_ManNodeNum(p);
}